

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          Locale *localeParam)

{
  int iVar1;
  char *src;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar2;
  ConstChar16Ptr local_a8;
  undefined1 local_9d;
  undefined4 local_9c;
  ConstChar16Ptr local_98;
  undefined1 local_8d;
  uint local_8c;
  char16_t *pcStack_88;
  int32_t ix;
  UChar *localeStr;
  int32_t local_6c;
  undefined1 local_68 [4];
  int32_t len;
  UnicodeString localeName;
  Locale *localeParam_local;
  int32_t index_local;
  RuleBasedNumberFormat *this_local;
  UnicodeString *bogus;
  
  localeName.fUnion._48_8_ = localeParam;
  if (((this->localizations == (LocalizationInfo *)0x0) || (index < 0)) ||
     (iVar1 = (*this->localizations->_vptr_LocalizationInfo[3])(), iVar1 <= index)) {
    UnicodeString::UnicodeString(__return_storage_ptr__);
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    src = Locale::getBaseName((Locale *)localeName.fUnion._48_8_);
    UnicodeString::UnicodeString((UnicodeString *)local_68,src,-1,kInvariant);
    local_6c = UnicodeString::length((UnicodeString *)local_68);
    pcStack_88 = UnicodeString::getBuffer((UnicodeString *)local_68,local_6c + 1);
    while (-1 < local_6c) {
      pcStack_88[local_6c] = L'\0';
      local_8c = (*this->localizations->_vptr_LocalizationInfo[8])(this->localizations,pcStack_88);
      if (-1 < (int)local_8c) {
        local_8d = 0;
        iVar1 = (*this->localizations->_vptr_LocalizationInfo[7])
                          (this->localizations,(ulong)local_8c,(ulong)(uint)index);
        ConstChar16Ptr::ConstChar16Ptr(&local_98,(char16_t *)CONCAT44(extraout_var,iVar1));
        UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_98,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_98);
        local_8d = 1;
        goto LAB_0027adce;
      }
      do {
        local_6c = local_6c + -1;
        bVar2 = false;
        if (0 < local_6c) {
          bVar2 = pcStack_88[local_6c] != L'_';
        }
      } while (bVar2);
      while( true ) {
        bVar2 = false;
        if (0 < local_6c) {
          bVar2 = pcStack_88[local_6c + -1] == L'_';
        }
        if (!bVar2) break;
        local_6c = local_6c + -1;
      }
    }
    local_9d = 0;
    iVar1 = (*this->localizations->_vptr_LocalizationInfo[4])
                      (this->localizations,(ulong)(uint)index);
    ConstChar16Ptr::ConstChar16Ptr(&local_a8,(char16_t *)CONCAT44(extraout_var_00,iVar1));
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_a8,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
    local_9d = 1;
LAB_0027adce:
    local_9c = 1;
    UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(int32_t index, const Locale& localeParam) {
    if (localizations && index >= 0 && index < localizations->getNumberOfRuleSets()) {
        UnicodeString localeName(localeParam.getBaseName(), -1, UnicodeString::kInvariant); 
        int32_t len = localeName.length();
        UChar* localeStr = localeName.getBuffer(len + 1);
        while (len >= 0) {
            localeStr[len] = 0;
            int32_t ix = localizations->indexForLocale(localeStr);
            if (ix >= 0) {
                UnicodeString name(TRUE, localizations->getDisplayName(ix, index), -1);
                return name;
            }
            
            // trim trailing portion, skipping over ommitted sections
            do { --len;} while (len > 0 && localeStr[len] != 0x005f); // underscore
            while (len > 0 && localeStr[len-1] == 0x005F) --len;
        }
        UnicodeString name(TRUE, localizations->getRuleSetName(index), -1);
        return name;
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}